

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall arealights::Application::loadShaders(Application *this)

{
  string *psVar1;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [16];
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [16];
  Application *this_local;
  
  local_18._8_8_ = this;
  psVar1 = (string *)
           std::
           __shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_renderHelper);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"../assets/TextureBlitToSRGB.vs.glsl",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"../assets/TextureBlitToSRGB.fs.glsl",(allocator<char> *)(local_80 + 0xf));
  RenderHelper::makeSimpleShader((RenderHelper *)local_18,psVar1,&local_38);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator=
            (&this->_blitSRGBProgram,
             (unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  psVar1 = (string *)
           std::
           __shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_renderHelper);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"../assets/Clustering.vs.glsl",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"../assets/Clustering.fs.glsl",&local_c9);
  RenderHelper::makeSimpleShader((RenderHelper *)local_80,psVar1,&local_a0);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::operator=
            (&this->_clusteringShader,
             (unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_80);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_80);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  return;
}

Assistant:

void Application::loadShaders()
{
    _blitSRGBProgram = _renderHelper->makeSimpleShader(
        "../assets/TextureBlitToSRGB.vs.glsl",
        "../assets/TextureBlitToSRGB.fs.glsl"
    );

    _clusteringShader = _renderHelper->makeSimpleShader(
        "../assets/Clustering.vs.glsl",
        "../assets/Clustering.fs.glsl"
    );
}